

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::UTF8CollationIterator::handleNextCE32
          (UTF8CollationIterator *this,UChar32 *c,UErrorCode *param_2)

{
  byte bVar1;
  int iVar2;
  uint8_t *s;
  UTrie2 *pUVar3;
  UChar32 c_00;
  uint32_t uVar4;
  uint32_t *puVar5;
  uint c_01;
  ulong uVar6;
  uint uVar7;
  
  iVar2 = this->pos;
  if (iVar2 == this->length) {
    *c = -1;
    return 0xc0;
  }
  s = this->u8;
  this->pos = iVar2 + 1;
  bVar1 = s[iVar2];
  uVar6 = (ulong)bVar1;
  *c = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    c_01 = (uint)bVar1;
    if (((bVar1 & 0xf0) == 0xe0) &&
       (iVar2 = this->pos, iVar2 + 1 < this->length || this->length < 0)) {
      if ((((byte)" 000000000000\x1000"[c_01 & 0xf] >> (s[iVar2] >> 5) & 1) != 0) &&
         ((byte)(s[(long)iVar2 + 1] ^ 0x80) < 0x40)) {
        *c = (s[iVar2] & 0x3f) << 6 | (c_01 & 0xf) << 0xc | s[(long)iVar2 + 1] ^ 0x80;
        this->pos = this->pos + 2;
        pUVar3 = (this->super_CollationIterator).trie;
        puVar5 = pUVar3->data32;
        uVar6 = (ulong)((*c & 0x1fU) + (uint)pUVar3->index[*c >> 5] * 4);
        goto LAB_0022820f;
      }
    }
    if (((0x1d < (byte)(bVar1 + 0x3e)) || (this->pos == this->length)) ||
       (uVar7 = s[this->pos] ^ 0x80, 0x3f < (byte)uVar7)) {
      c_00 = utf8_nextCharSafeBody_63(s,&this->pos,this->length,c_01,-3);
      *c = c_00;
      uVar4 = CollationData::getCE32((this->super_CollationIterator).data,c_00);
      return uVar4;
    }
    pUVar3 = (this->super_CollationIterator).trie;
    uVar4 = pUVar3->data32[pUVar3->index[(ulong)c_01 + 0x760] + uVar7];
    *c = (c_01 & 0x1f) << 6 | uVar7;
    this->pos = this->pos + 1;
  }
  else {
    puVar5 = ((this->super_CollationIterator).trie)->data32;
LAB_0022820f:
    uVar4 = puVar5[uVar6];
  }
  return uVar4;
}

Assistant:

uint32_t
UTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode & /*errorCode*/) {
    if(pos == length) {
        c = U_SENTINEL;
        return Collation::FALLBACK_CE32;
    }
    // Optimized combination of U8_NEXT_OR_FFFD() and UTRIE2_U8_NEXT32().
    c = u8[pos++];
    if(U8_IS_SINGLE(c)) {
        // ASCII 00..7F
        return trie->data32[c];
    }
    uint8_t t1, t2;
    if(0xe0 <= c && c < 0xf0 &&
            ((pos + 1) < length || length < 0) &&
            U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
            (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
        // U+0800..U+FFFF except surrogates
        c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
        pos += 2;
        return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
    } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
        // U+0080..U+07FF
        uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
        c = ((c & 0x1f) << 6) | t1;
        ++pos;
        return ce32;
    } else {
        // Function call for supplementary code points and error cases.
        // Illegal byte sequences yield U+FFFD.
        c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
        return data->getCE32(c);
    }
}